

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_reporting.cc
# Opt level: O0

google * __thiscall google::XMLText(google *this,string *txt)

{
  ulong uVar1;
  size_type pos_1;
  size_type pos;
  string *txt_local;
  string *ans;
  
  std::__cxx11::string::string((string *)this,(string *)txt);
  while (uVar1 = std::__cxx11::string::find((char *)this,0x2b0ae4), uVar1 != 0xffffffffffffffff) {
    std::__cxx11::string::replace((ulong)this,uVar1,(char *)0x1);
  }
  while (uVar1 = std::__cxx11::string::find((char *)this,0x2b0ae6), uVar1 != 0xffffffffffffffff) {
    std::__cxx11::string::replace((ulong)this,uVar1,(char *)0x1);
  }
  return this;
}

Assistant:

static string XMLText(const string& txt) {
  string ans = txt;
  for (string::size_type pos = 0; (pos = ans.find("&", pos)) != string::npos; )
    ans.replace(pos++, 1, "&amp;");
  for (string::size_type pos = 0; (pos = ans.find("<", pos)) != string::npos; )
    ans.replace(pos++, 1, "&lt;");
  return ans;
}